

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_common(Curl_easy *data,connectdata *conn,int sockindex,_Bool nonblocking,
                            _Bool *done)

{
  curl_socket_t cVar1;
  CURLcode CVar2;
  int iVar3;
  ssl_connect_data *psVar4;
  timediff_t tVar5;
  uint *puVar6;
  bool bVar7;
  timediff_t local_80;
  curl_socket_t local_6c;
  curl_socket_t local_68;
  curl_socket_t readfd;
  curl_socket_t writefd;
  timediff_t timeout_ms_1;
  timediff_t timeout_ms;
  int what;
  curl_socket_t sockfd;
  ssl_connect_data *connssl;
  CURLcode result;
  _Bool *done_local;
  _Bool nonblocking_local;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  psVar4 = conn->ssl + sockindex;
  cVar1 = conn->sock[sockindex];
  if (psVar4->state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  if (psVar4->connecting_state == ssl_connect_1) {
    tVar5 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar5 < 0) {
      Curl_failf(data,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    CVar2 = ossl_connect_step1(data,conn,sockindex);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  while( true ) {
    do {
      bVar7 = true;
      if ((psVar4->connecting_state != ssl_connect_2) &&
         (bVar7 = true, psVar4->connecting_state != ssl_connect_2_reading)) {
        bVar7 = psVar4->connecting_state == ssl_connect_2_writing;
      }
      if (!bVar7) {
        if ((psVar4->connecting_state != ssl_connect_3) ||
           (data_local._4_4_ = ossl_connect_step3(data,conn,sockindex), data_local._4_4_ == CURLE_OK
           )) {
          if (psVar4->connecting_state == ssl_connect_done) {
            psVar4->state = ssl_connection_complete;
            conn->recv[sockindex] = ossl_recv;
            conn->send[sockindex] = ossl_send;
            *done = true;
          }
          else {
            *done = false;
          }
          psVar4->connecting_state = ssl_connect_1;
          data_local._4_4_ = CURLE_OK;
        }
        return data_local._4_4_;
      }
      local_80 = Curl_timeleft(data,(curltime *)0x0,true);
      if (local_80 < 0) {
        Curl_failf(data,"SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      if ((psVar4->connecting_state == ssl_connect_2_reading) ||
         (psVar4->connecting_state == ssl_connect_2_writing)) {
        local_68 = cVar1;
        if (psVar4->connecting_state != ssl_connect_2_writing) {
          local_68 = -1;
        }
        local_6c = cVar1;
        if (psVar4->connecting_state != ssl_connect_2_reading) {
          local_6c = -1;
        }
        if (nonblocking) {
          local_80 = 0;
        }
        iVar3 = Curl_socket_check(local_6c,-1,local_68,local_80);
        if (iVar3 < 0) {
          puVar6 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar6);
          return CURLE_SSL_CONNECT_ERROR;
        }
        if (iVar3 == 0) {
          if (nonblocking) {
            *done = false;
            return CURLE_OK;
          }
          Curl_failf(data,"SSL connection timeout");
          return CURLE_OPERATION_TIMEDOUT;
        }
      }
      CVar2 = ossl_connect_step2(data,conn,sockindex);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    } while (!nonblocking);
    if (psVar4->connecting_state == ssl_connect_2) {
      return CURLE_OK;
    }
    if (psVar4->connecting_state == ssl_connect_2_reading) break;
    if (psVar4->connecting_state == ssl_connect_2_writing) {
      return CURLE_OK;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(data, conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(data, conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(data, conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}